

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O3

uint zng_read_buf(zng_stream *strm,uchar *buf,uint size)

{
  uint uVar1;
  int iVar2;
  uint32_t uVar3;
  
  uVar1 = strm->avail_in;
  if (uVar1 < size) {
    size = uVar1;
  }
  if (size != 0) {
    strm->avail_in = uVar1 - size;
    iVar2 = strm->state->wrap;
    if (iVar2 == 1) {
      uVar3 = (*functable.adler32_fold_copy)(strm->adler,buf,strm->next_in,(size_t)size);
      strm->adler = uVar3;
    }
    else if (iVar2 == 2) {
      (*functable.crc32_fold_copy)(&strm->state->crc_fold,buf,strm->next_in,(size_t)size);
    }
    else {
      memcpy(buf,strm->next_in,(ulong)size);
    }
    strm->next_in = strm->next_in + size;
    strm->total_in = strm->total_in + (ulong)size;
  }
  return size;
}

Assistant:

Z_INTERNAL unsigned PREFIX(read_buf)(PREFIX3(stream) *strm, unsigned char *buf, unsigned size) {
    uint32_t len = MIN(strm->avail_in, size);
    if (len == 0)
        return 0;

    strm->avail_in  -= len;

    if (!DEFLATE_NEED_CHECKSUM(strm)) {
        memcpy(buf, strm->next_in, len);
#ifdef GZIP
    } else if (strm->state->wrap == 2) {
        FUNCTABLE_CALL(crc32_fold_copy)(&strm->state->crc_fold, buf, strm->next_in, len);
#endif
    } else if (strm->state->wrap == 1) {
        strm->adler = FUNCTABLE_CALL(adler32_fold_copy)(strm->adler, buf, strm->next_in, len);
    } else {
        memcpy(buf, strm->next_in, len);
    }
    strm->next_in  += len;
    strm->total_in += len;

    return len;
}